

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleTimeZone::setEndRule
          (SimpleTimeZone *this,int32_t month,int32_t dayOfMonth,int32_t time,TimeMode mode,
          UErrorCode *status)

{
  setEndRule(this,month,dayOfMonth,0,time,mode,status);
  return;
}

Assistant:

void 
SimpleTimeZone::setEndRule(int32_t month, int32_t dayOfMonth, 
                           int32_t time, TimeMode mode, UErrorCode& status)
{
    setEndRule(month, dayOfMonth, 0, time, mode, status);
}